

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

OBS_TYPE __thiscall
despot::Parser::GetPOMDPXObservation
          (Parser *this,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *observe)

{
  int iVar1;
  mapped_type *pmVar2;
  long lVar3;
  OBS_TYPE OVar4;
  pointer pNVar5;
  ulong uVar6;
  string local_50;
  
  pNVar5 = (this->obs_vars_).super__Vector_base<despot::NamedVar,_std::allocator<despot::NamedVar>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar3 = 0;
  OVar4 = 0;
  for (uVar6 = 0;
      uVar6 < (ulong)(((long)(this->obs_vars_).
                             super__Vector_base<despot::NamedVar,_std::allocator<despot::NamedVar>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pNVar5) / 0x78);
      uVar6 = uVar6 + 1) {
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](observe,(key_type *)((long)&(pNVar5->name_)._M_dataplus._M_p + lVar3));
    std::__cxx11::string::string((string *)&local_50,(string *)pmVar2);
    iVar1 = Variable::IndexOf((Variable *)((long)&(pNVar5->super_Variable)._vptr_Variable + lVar3),
                              &local_50);
    std::__cxx11::string::~string((string *)&local_50);
    pNVar5 = (this->obs_vars_).
             super__Vector_base<despot::NamedVar,_std::allocator<despot::NamedVar>_>._M_impl.
             super__Vector_impl_data._M_start;
    OVar4 = (long)iVar1 +
            (long)(int)((ulong)(*(long *)((long)&(pNVar5->super_Variable).values_.
                                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         + lVar3 + 8U) -
                               *(long *)((long)&(pNVar5->super_Variable).values_.
                                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        + lVar3)) >> 5) * OVar4;
    lVar3 = lVar3 + 0x78;
  }
  return OVar4;
}

Assistant:

OBS_TYPE Parser::GetPOMDPXObservation(map<string, string>& observe) {
	OBS_TYPE obs = 0;
	for (int o = 0; o < obs_vars_.size(); o++) {
		int index = obs_vars_[o].IndexOf(observe[obs_vars_[o].name()]);
		obs = obs * obs_vars_[o].Size() + index;
	}
	return obs;
}